

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_filter.cc
# Opt level: O0

int __thiscall
sptk::reaper::FdFilter::FilterArray
          (FdFilter *this,int16_t *input,int nIn,bool first,bool last,int16_t *output,
          int max_to_output)

{
  byte in_CL;
  int in_EDX;
  undefined2 *in_RSI;
  long *in_RDI;
  byte in_R8B;
  undefined2 *in_R9;
  int in_stack_00000008;
  int *in_stack_00000010;
  int toCopy;
  int16_t *r;
  int16_t *q;
  int16_t *p;
  int available;
  int toWrite;
  int toRead;
  int nToGo;
  int nOut;
  int nLeft;
  int j;
  int i;
  int local_64;
  undefined2 *local_60;
  undefined2 *local_58;
  undefined2 *local_50;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_4;
  
  local_38 = 0;
  local_3c = in_stack_00000008;
  if ((in_CL & 1) != 0) {
    *(undefined4 *)(in_RDI + 7) = 1;
    *(undefined4 *)((long)in_RDI + 0x2c) = 0;
    *(undefined4 *)(in_RDI + 6) = 0;
  }
  local_60 = in_R9;
  if (*(int *)((long)in_RDI + 0x2c) != 0) {
    local_64 = *(int *)((long)in_RDI + 0x2c);
    if (in_stack_00000008 < local_64) {
      local_64 = in_stack_00000008;
    }
    local_2c = (int)in_RDI[6];
    local_60 = in_R9;
    for (local_30 = 0; local_30 < local_64; local_30 = local_30 + 1) {
      *local_60 = *(undefined2 *)(*in_RDI + (long)local_2c * 2);
      local_2c = local_2c + 1;
      local_60 = local_60 + 1;
    }
    local_3c = in_stack_00000008 - local_64;
    local_38 = local_64;
    *(int *)((long)in_RDI + 0x2c) = *(int *)((long)in_RDI + 0x2c) - local_64;
    *(int *)(in_RDI + 6) = local_2c;
  }
  local_50 = in_RSI;
  local_34 = in_EDX;
  if (local_3c < 1) {
    *(undefined4 *)((long)in_RDI + 0x34) = 0;
    local_4 = in_stack_00000008;
  }
  else {
    do {
      if (local_34 < 1) {
        *(int *)((long)in_RDI + 0x34) = in_EDX;
        return local_38;
      }
      local_40 = local_34;
      if ((int)in_RDI[0x10] < local_34) {
        local_40 = (int)in_RDI[0x10];
      }
      if ((int)in_RDI[0xf] < 2) {
        local_58 = (undefined2 *)in_RDI[1];
        for (local_2c = 0; local_2c < local_40; local_2c = local_2c + 1) {
          *local_58 = *local_50;
          local_58 = local_58 + 1;
          local_50 = local_50 + 1;
        }
      }
      else {
        local_58 = (undefined2 *)in_RDI[1];
        for (local_2c = 0; local_2c < local_40; local_2c = local_2c + 1) {
          *local_58 = *local_50;
          for (local_30 = 1; local_58 = local_58 + 1, local_30 < (int)in_RDI[0xf];
              local_30 = local_30 + 1) {
            *local_58 = 0;
          }
          local_50 = local_50 + 1;
        }
      }
      local_34 = local_34 - local_40;
      if ((local_34 < 1) && ((in_R8B & 1) != 0)) {
        *(uint *)(in_RDI + 7) = *(uint *)(in_RDI + 7) | 2;
      }
      FilterBuffer((FdFilter *)q,r._4_4_,in_stack_00000010);
      *(undefined4 *)(in_RDI + 7) = 0;
      local_44 = local_48;
      if (local_3c < local_48) {
        local_44 = local_3c;
      }
      for (local_2c = 0; local_2c < local_44; local_2c = local_2c + 1) {
        *local_60 = *(undefined2 *)(*in_RDI + (long)local_2c * 2);
        local_60 = local_60 + 1;
      }
      local_38 = local_44 + local_38;
      local_48 = local_48 - local_44;
    } while (local_48 < 1);
    *(int *)((long)in_RDI + 0x2c) = local_48;
    *(int *)(in_RDI + 6) = local_2c;
    *(int *)((long)in_RDI + 0x34) = in_EDX - local_34;
    local_4 = local_38;
  }
  return local_4;
}

Assistant:

int FdFilter::FilterArray(int16_t *input, int nIn, bool first, bool last,
                          int16_t *output, int max_to_output) {
  int i, j, nLeft = nIn, nOut = 0, nToGo = max_to_output;
  int  toRead, toWrite, available;
  int16_t *p = input, *q, *r = output;

  if (first) {
    filter_state_ = 1;  // indicate start of new signal
    array_leftover_ = 0;
    array_index_ = 0;
  }
  if (array_leftover_) {  // First, move any output remaining from the
                         // previous call.
    int toCopy = array_leftover_;
    if (toCopy > nToGo)
      toCopy = nToGo;
    for (i = array_index_, j = 0; j < toCopy; i++, j++)
      *r++ = output_buffer_[i];
    nToGo -= toCopy;
    nOut += toCopy;
    array_leftover_ -= toCopy;
    array_index_ = i;
  }

  if (nToGo <= 0) {
    array_samples_used_ = 0;  // Can't process any input this time; no
                             // room in output array.
    return max_to_output;
  }

  /* Process data from array to array. */
  while (nLeft > 0) {
    toRead = nLeft;
    if (toRead > max_input_)
      toRead = max_input_;
    if (insert_ > 1) {
      for (q = input_buffer_, i = 0; i < toRead; i++) {
        *q++ = *p++;
        for (j = 1; j < insert_; j++)
          *q++ = 0;
      }
    } else {
      for (q = input_buffer_, i = 0; i < toRead; i++)
        *q++ = *p++;
    }
    nLeft -= toRead;
    if ((nLeft <= 0) && last)
      filter_state_ |= 2;  // Indicate that end of signal is (also) in
                           // this bufferful.
    FilterBuffer(toRead * insert_, &available);
    filter_state_ = 0;  // Clear the initialization bit, if any for the
                       // next iteration.

    toWrite = available;
    if (toWrite > nToGo)
      toWrite = nToGo;

    for (i = 0; i < toWrite; i++)
      *r++ = output_buffer_[i];
    nOut += toWrite;
    available -= toWrite;
    if (available > 0) {  // Ran out of output space; suspend processing
      array_leftover_ = available;  // Save the remaining output
                                    // samples for the next call.
      array_index_ = i;
      array_samples_used_ = nIn - nLeft;  // Record the number of input
                                         // samples actually used.
      return(nOut);
    }
  }
  array_samples_used_ = nIn;
  return(nOut);
}